

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  ImDrawList *pIVar1;
  float fVar2;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImDrawList *local_50;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  int local_2c;
  float local_28;
  ImU32 alpha8;
  float alpha_local;
  float bar_w_local;
  ImDrawList *draw_list_local;
  ImVec2 half_sz_local;
  ImVec2 pos_local;
  
  local_28 = alpha;
  alpha8 = (ImU32)bar_w;
  _alpha_local = draw_list;
  draw_list_local = (ImDrawList *)half_sz;
  half_sz_local = pos;
  fVar2 = ImSaturate(alpha);
  pIVar1 = _alpha_local;
  local_2c = (int)(fVar2 * 255.0 + 0.5);
  ImVec2::ImVec2(&local_34,half_sz_local.x + draw_list_local._0_4_ + 1.0,half_sz_local.y);
  ImVec2::ImVec2(&local_3c,draw_list_local._0_4_ + 2.0,draw_list_local._4_4_ + 1.0);
  ImGui::RenderArrowPointingAt(pIVar1,local_34,local_3c,1,local_2c << 0x18);
  pIVar1 = _alpha_local;
  ImVec2::ImVec2(&local_44,half_sz_local.x + draw_list_local._0_4_,half_sz_local.y);
  local_50 = draw_list_local;
  ImGui::RenderArrowPointingAt
            (pIVar1,local_44,(ImVec2)draw_list_local,1,local_2c << 0x18 | 0xffffff);
  pIVar1 = _alpha_local;
  ImVec2::ImVec2(&local_58,((half_sz_local.x + (float)alpha8) - draw_list_local._0_4_) - 1.0,
                 half_sz_local.y);
  ImVec2::ImVec2(&local_60,draw_list_local._0_4_ + 2.0,draw_list_local._4_4_ + 1.0);
  ImGui::RenderArrowPointingAt(pIVar1,local_58,local_60,0,local_2c << 0x18);
  pIVar1 = _alpha_local;
  ImVec2::ImVec2(&local_68,(half_sz_local.x + (float)alpha8) - draw_list_local._0_4_,half_sz_local.y
                );
  ImGui::RenderArrowPointingAt
            (pIVar1,local_68,(ImVec2)draw_list_local,0,local_2c << 0x18 | 0xffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}